

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

int __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>::
ReadNumArgs(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_SparsityPrinter>
            *this,int min_args)

{
  int iVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  ArgList local_28;
  
  iVar1 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt(this->reader_);
  if (iVar1 < min_args) {
    local_38 = 0;
    uStack_30 = 0;
    local_28.types_ = 0;
    local_28.field_1.values_ = (Value *)&local_38;
    BinaryReaderBase::ReportError
              (&this->reader_->super_BinaryReaderBase,(CStringRef)0x139f91,&local_28);
  }
  return iVar1;
}

Assistant:

int ReadNumArgs(int min_args = MIN_ITER_ARGS) {
    int num_args = reader_.ReadUInt();
    if (num_args < min_args)
      reader_.ReportError("too few arguments");
    return num_args;
  }